

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O3

int lls_normal(double *A,double *b,int M,int N,double *x)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  size_t __size;
  int iVar4;
  double *col;
  double *C;
  double *C_00;
  double *__ptr;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  
  lVar11 = (long)N;
  col = (double *)malloc(M * lVar11 * 8);
  __size = lVar11 * 8;
  C = (double *)malloc(__size);
  C_00 = (double *)malloc(__size * lVar11);
  __ptr = (double *)malloc(__size);
  pdVar5 = (double *)malloc(__size * lVar11);
  mtranspose(A,M,N,col);
  mmult(col,b,C,N,M,1);
  mmult(col,A,C_00,N,M,N);
  iVar4 = chol(C_00,N);
  if (iVar4 == -1) {
    iVar4 = -1;
  }
  else {
    mtranspose(C_00,N,N,pdVar5);
    *__ptr = *C / *pdVar5;
    uVar6 = (ulong)(uint)N;
    if (1 < N) {
      uVar8 = 1;
      pdVar7 = pdVar5;
      do {
        pdVar7 = pdVar7 + uVar6;
        dVar12 = 0.0;
        uVar9 = 0;
        do {
          dVar12 = dVar12 + __ptr[uVar9] * pdVar7[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
        __ptr[uVar8] = (C[uVar8] - dVar12) / pdVar5[uVar8 * uVar6 + uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar6);
    }
    uVar1 = N - 1;
    x[(int)uVar1] = __ptr[(int)uVar1] / C_00[(ulong)(uint)(N * N) - 1];
    if (1 < N) {
      uVar9 = (ulong)(N - 2);
      pdVar7 = C_00 + uVar9 * (uVar6 + 1) + 1;
      pdVar5 = x + uVar1;
      uVar8 = 1;
      do {
        dVar12 = 0.0;
        if ((long)uVar9 < lVar11 + -1) {
          uVar10 = 0;
          do {
            pdVar2 = pdVar7 + uVar10;
            pdVar3 = pdVar5 + uVar10;
            uVar10 = uVar10 + 1;
            dVar12 = dVar12 + *pdVar2 * *pdVar3;
          } while (uVar8 != uVar10);
        }
        x[uVar9] = (__ptr[uVar9] - dVar12) / C_00[uVar9 * (uVar6 + 1)];
        uVar9 = uVar9 - 1;
        uVar8 = uVar8 + 1;
        pdVar7 = (double *)((long)pdVar7 - (uVar6 * 8 + 8));
        pdVar5 = pdVar5 + -1;
      } while (uVar8 != uVar6);
    }
    free(col);
    free(C);
    free(C_00);
    free(__ptr);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int lls_normal(double *A,double *b,int M,int N,double *x) {
	int retcode,sc,i,j,c1,l;
	double sum;
	double *AT,*d,*C,*y,*CT;
	// M - data points
	// N - Number of parameters
	// A - MXN; b size - M vector; AT - NXM

	AT = (double*) malloc(sizeof(double) * M * N);
	d = (double*) malloc(sizeof(double) * N);
	C = (double*) malloc(sizeof(double) * N * N);
	y = (double*) malloc(sizeof(double) * N);
	CT = (double*) malloc(sizeof(double) * N * N);

	retcode = 0;

	mtranspose(A,M,N,AT);
	mmult(AT,b,d,N,M,1);
	mmult(AT,A,C,N,M,N);

	sc = chol(C,N);
	if (sc == -1) {
		return -1;
	}

	mtranspose(C,N,N,CT);
	//Forward Substitution

	y[0] = d[0]/CT[0];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * CT[c1 + j];
		}
		y[i] = (d[i] - sum)/CT[c1+i];
	}

	//Back Substitution

	x[N - 1] = y[N - 1]/C[N * N - 1];

	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += C[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / C[c1];
	}

	free(AT);
	free(d);
	free(C);
	free(y);
	return retcode;
}